

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_string_radix_sort.h
# Opt level: O0

void __thiscall
parallel_string_radix_sort::ParallelStringRadixSort<const_unsigned_char_*>::Sort16
          (ParallelStringRadixSort<const_unsigned_char_*> *this,size_t bgn,size_t end,size_t depth,
          bool flip)

{
  ushort uVar1;
  uchar *puVar2;
  uint16_t uVar3;
  uchar **__s;
  uchar *local_e0;
  uchar **local_d0;
  uchar **local_c8;
  ulong local_b0;
  size_t i_5;
  size_t j;
  size_t e;
  size_t b;
  ulong uStack_88;
  int i_4;
  size_t i_3;
  uchar *puStack_78;
  int i_2;
  size_t s;
  size_t i_1;
  ulong uStack_60;
  uint16_t x;
  size_t i;
  size_t n;
  uint16_t *let;
  uchar **dst;
  uchar **src;
  size_t *cnt;
  size_t sStack_28;
  bool flip_local;
  size_t depth_local;
  size_t end_local;
  size_t bgn_local;
  ParallelStringRadixSort<const_unsigned_char_*> *this_local;
  
  cnt._7_1_ = flip;
  sStack_28 = depth;
  depth_local = end;
  end_local = bgn;
  bgn_local = (size_t)this;
  __s = (uchar **)operator_new__(0x80000);
  memset(__s,0,0x80000);
  src = __s;
  if (__s == (uchar **)0x0) {
    fprintf(_stderr,"CHECK Failed(%s:%d): %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/external/parallel_string_radix_sort.h"
            ,0x11e,"cnt != NULL");
    exit(1);
  }
  if ((cnt._7_1_ & 1) == 0) {
    local_c8 = this->data_;
  }
  else {
    local_c8 = this->temp_;
  }
  dst = local_c8 + end_local;
  if ((cnt._7_1_ & 1) == 0) {
    local_d0 = this->temp_;
  }
  else {
    local_d0 = this->data_;
  }
  let = (uint16_t *)(local_d0 + end_local);
  n = (size_t)(this->letters16_ + end_local);
  i = depth_local - end_local;
  for (uStack_60 = 0; uStack_60 < i; uStack_60 = uStack_60 + 1) {
    i_1._6_2_ = (ushort)dst[uStack_60][sStack_28];
    if (i_1._6_2_ == 0) {
      uVar3 = 0;
    }
    else {
      uVar3 = CONCAT11(dst[uStack_60][sStack_28],dst[uStack_60][sStack_28 + 1]);
    }
    *(uint16_t *)(n + uStack_60 * 2) = uVar3;
  }
  for (s = 0; s < i; s = s + 1) {
    __s[*(ushort *)(n + s * 2)] = __s[*(ushort *)(n + s * 2)] + 1;
  }
  puStack_78 = (uchar *)0x0;
  for (i_3._4_4_ = 0; i_3._4_4_ < 0x10000; i_3._4_4_ = i_3._4_4_ + 1) {
    std::swap<unsigned_long>
              ((unsigned_long *)(src + i_3._4_4_),(unsigned_long *)&stack0xffffffffffffff88);
    puStack_78 = src[i_3._4_4_] + (long)puStack_78;
  }
  for (uStack_88 = 0; uStack_88 < i; uStack_88 = uStack_88 + 1) {
    uVar1 = *(ushort *)(n + uStack_88 * 2);
    puVar2 = src[uVar1];
    src[uVar1] = puVar2 + 1;
    std::swap<unsigned_char_const*>((uchar **)(let + (long)puVar2 * 4),dst + uStack_88);
  }
  if ((cnt._7_1_ & 1) == 0) {
    for (b._4_4_ = 0; b._4_4_ < 0x100; b._4_4_ = b._4_4_ + 1) {
      if (b._4_4_ == 0) {
        local_e0 = (uchar *)0x0;
      }
      else {
        local_e0 = src[b._4_4_ * 0x100 + -1];
      }
      puVar2 = src[b._4_4_ << 8];
      for (i_5 = (size_t)local_e0; i_5 < puVar2; i_5 = i_5 + 1) {
        std::swap<unsigned_char_const*>(dst + i_5,(uchar **)(let + i_5 * 4));
      }
    }
  }
  for (local_b0 = 1; local_b0 < 0x10000; local_b0 = local_b0 + 1) {
    if (((local_b0 & 0xff) != 0) && (src[local_b0] != src[local_b0 - 1])) {
      Recurse(this,(size_t)(src[local_b0 - 1] + end_local),(size_t)(src[local_b0] + end_local),
              sStack_28 + 2,(bool)((cnt._7_1_ ^ 0xff) & 1));
    }
  }
  if (src != (uchar **)0x0) {
    operator_delete__(src);
  }
  return;
}

Assistant:

void ParallelStringRadixSort<StringType>
::Sort16(size_t bgn, size_t end, size_t depth, bool flip) {
  size_t *cnt = new size_t[1 << 16]();
  PSRS_CHECK(cnt != NULL);

  StringType *src = (flip ? temp_ : data_) + bgn;
  StringType *dst = (flip ? data_ : temp_) + bgn;
  uint16_t *let = letters16_ + bgn;
  size_t n = end - bgn;

  for (size_t i = 0; i < n; ++i) {
    uint16_t x = src[i][depth];
    let[i] = x == 0 ? 0 : ((x << 8) | src[i][depth + 1]);
  }

  for (size_t i = 0; i < n; ++i) {
    ++cnt[let[i]];
  }

  size_t s = 0;
  for (int i = 0; i < 1 << 16; ++i) {
    std::swap(cnt[i], s);
    s += cnt[i];
  }

  for (size_t i = 0; i < n; ++i) {
    std::swap(dst[cnt[let[i]]++], src[i]);
  }

  if (flip == false) {
    for (int i = 0; i < 1 << 8; ++i) {
      size_t b = i == 0 ? 0 : cnt[(i << 8) - 1];
      size_t e = cnt[i << 8];
      for (size_t j = b; j < e; ++j) {
        std::swap(src[j], dst[j]);
      }
    }
  }

  for (size_t i = 1; i < 1 << 16; ++i) {
    if ((i & 0xFF) != 0 && cnt[i] - cnt[i - 1] >= 1) {
      Recurse(bgn + cnt[i - 1], bgn + cnt[i], depth + 2, !flip);
    }
  }

  delete [] cnt;
}